

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O0

FragmentSource *
vkt::sr::anon_unknown_0::genFragmentShaderSource
          (FragmentSource *__return_storage_ptr__,bool requireGpuShader5,int numTexCoordComponents,
          DataType samplerType,string *funcCall,bool useNormalizedCoordInput,bool usePixCoord,
          OffsetSize offsetSize,ImageBackingMode sparseCase)

{
  DataType dataType;
  char *pcVar1;
  ostream *poVar2;
  string local_240;
  allocator<char> local_219;
  string local_218 [8];
  string outType;
  ostringstream frag;
  uint local_80;
  deUint32 binding;
  string local_70;
  undefined1 local_50 [8];
  string texCoordType;
  bool usePixCoord_local;
  bool useNormalizedCoordInput_local;
  string *funcCall_local;
  int local_18;
  DataType samplerType_local;
  int numTexCoordComponents_local;
  bool requireGpuShader5_local;
  
  texCoordType.field_2._M_local_buf[0xe] = usePixCoord;
  texCoordType.field_2._M_local_buf[0xf] = useNormalizedCoordInput;
  local_18 = numTexCoordComponents;
  samplerType_local._3_1_ = requireGpuShader5;
  _numTexCoordComponents_local = __return_storage_ptr__;
  de::toString<int>(&local_70,&local_18);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,"vec"
                 ,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(outType.field_2._M_local_buf + 8));
  dataType = getSamplerGatherResultType(samplerType);
  pcVar1 = glu::getDataTypeName(dataType);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_218,pcVar1,&local_219);
  std::allocator<char>::~allocator(&local_219);
  if (sparseCase == IMAGE_BACKING_MODE_SPARSE) {
    poVar2 = std::operator<<((ostream *)(outType.field_2._M_local_buf + 8),"#version 450\n");
    std::operator<<(poVar2,"#extension GL_ARB_sparse_texture2 : require\n");
  }
  else {
    std::operator<<((ostream *)(outType.field_2._M_local_buf + 8),"#version 310 es\n");
  }
  if ((samplerType_local._3_1_ & 1) != TYPE_INVALID >> 0x18) {
    std::operator<<((ostream *)(outType.field_2._M_local_buf + 8),
                    "#extension GL_EXT_gpu_shader5 : require\n");
  }
  poVar2 = std::operator<<((ostream *)(outType.field_2._M_local_buf + 8),
                           "\nlayout (location = 0) out mediump ");
  poVar2 = std::operator<<(poVar2,local_218);
  poVar2 = std::operator<<(poVar2," o_color;\n\nlayout (location = 0) in highp ");
  poVar2 = std::operator<<(poVar2,(string *)local_50);
  std::operator<<(poVar2," v_texCoord;\n");
  if ((texCoordType.field_2._M_local_buf[0xf] & 1U) != 0) {
    std::operator<<((ostream *)(outType.field_2._M_local_buf + 8),
                    "layout (location = 1) in highp vec2 v_normalizedCoord;\n");
  }
  poVar2 = std::operator<<((ostream *)(outType.field_2._M_local_buf + 8),"\nlayout (binding = ");
  local_80 = 1;
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0);
  poVar2 = std::operator<<(poVar2,") uniform highp ");
  pcVar1 = glu::getDataTypeName(samplerType);
  poVar2 = std::operator<<(poVar2,pcVar1);
  std::operator<<(poVar2," u_sampler;\n");
  if ((texCoordType.field_2._M_local_buf[0xe] & 1U) != 0) {
    poVar2 = std::operator<<((ostream *)(outType.field_2._M_local_buf + 8),"layout (binding = ");
    local_80 = 2;
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,1);
    std::operator<<(poVar2,") uniform viewportSize { highp vec2 u_viewportSize; };\n");
  }
  if (offsetSize == OFFSETSIZE_IMPLEMENTATION_MAXIMUM) {
    poVar2 = std::operator<<((ostream *)(outType.field_2._M_local_buf + 8),"layout (binding = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_80);
    std::operator<<(poVar2,") uniform offset { highp ivec2 u_offset; };\n");
  }
  std::operator<<((ostream *)(outType.field_2._M_local_buf + 8),"\nvoid main(void)\n{\n");
  if ((texCoordType.field_2._M_local_buf[0xe] & 1U) != 0) {
    std::operator<<((ostream *)(outType.field_2._M_local_buf + 8),
                    "\tivec2 pixCoord = ivec2(v_normalizedCoord*u_viewportSize);\n");
  }
  if (sparseCase == IMAGE_BACKING_MODE_SPARSE) {
    poVar2 = std::operator<<((ostream *)(outType.field_2._M_local_buf + 8),"\t");
    poVar2 = std::operator<<(poVar2,local_218);
    std::operator<<(poVar2," texel;\n");
    poVar2 = std::operator<<((ostream *)(outType.field_2._M_local_buf + 8),"\tint success = ");
    poVar2 = std::operator<<(poVar2,(string *)funcCall);
    std::operator<<(poVar2,";\n");
    poVar2 = std::operator<<((ostream *)(outType.field_2._M_local_buf + 8),
                             "\tif (sparseTexelsResidentARB(success))\n");
    poVar2 = std::operator<<(poVar2,"\t\to_color = texel;\n");
    poVar2 = std::operator<<(poVar2,"\telse\n");
    poVar2 = std::operator<<(poVar2,"\t\to_color = ");
    poVar2 = std::operator<<(poVar2,local_218);
    std::operator<<(poVar2,"(0.0, 0.0, 0.0, 1.0);\n");
  }
  else {
    poVar2 = std::operator<<((ostream *)(outType.field_2._M_local_buf + 8),"\t\to_color = ");
    poVar2 = std::operator<<(poVar2,(string *)funcCall);
    std::operator<<(poVar2,";\n");
  }
  std::operator<<((ostream *)(outType.field_2._M_local_buf + 8),"}\n");
  std::__cxx11::ostringstream::str();
  glu::FragmentSource::FragmentSource(__return_storage_ptr__,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string(local_218);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(outType.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_50);
  return __return_storage_ptr__;
}

Assistant:

glu::FragmentSource genFragmentShaderSource (bool					requireGpuShader5,
											 int					numTexCoordComponents,
											 glu::DataType			samplerType,
											 const string&			funcCall,
											 bool					useNormalizedCoordInput,
											 bool					usePixCoord,
											 OffsetSize				offsetSize,
											 const ImageBackingMode	sparseCase)
{
	DE_ASSERT(glu::isDataTypeSampler(samplerType));
	DE_ASSERT(de::inRange(numTexCoordComponents, 2, 3));
	DE_ASSERT(!usePixCoord || useNormalizedCoordInput);

	const string		texCoordType	= "vec" + de::toString(numTexCoordComponents);
	deUint32			binding			= 0;
	std::ostringstream	frag;
	const string		outType			= glu::getDataTypeName(getSamplerGatherResultType(samplerType));

	if (sparseCase == ShaderRenderCaseInstance::IMAGE_BACKING_MODE_SPARSE)
		frag	<< "#version 450\n"
				<< "#extension GL_ARB_sparse_texture2 : require\n";
	else
		frag << "#version 310 es\n";

	if (requireGpuShader5)
		frag << "#extension GL_EXT_gpu_shader5 : require\n";

	frag << "\n"
			"layout (location = 0) out mediump " << outType << " o_color;\n"
			"\n"
			"layout (location = 0) in highp " << texCoordType << " v_texCoord;\n";

	if (useNormalizedCoordInput)
		frag << "layout (location = 1) in highp vec2 v_normalizedCoord;\n";

	frag << "\n"
			"layout (binding = " << binding++ << ") uniform highp " << glu::getDataTypeName(samplerType) << " u_sampler;\n";

	if (usePixCoord)
		frag << "layout (binding = " << binding++ << ") uniform viewportSize { highp vec2 u_viewportSize; };\n";

	if (offsetSize == OFFSETSIZE_IMPLEMENTATION_MAXIMUM)
		frag << "layout (binding = " << binding++ << ") uniform offset { highp ivec2 u_offset; };\n";

	frag << "\n"
			"void main(void)\n"
			"{\n";

	if (usePixCoord)
		frag << "	ivec2 pixCoord = ivec2(v_normalizedCoord*u_viewportSize);\n";

	if (sparseCase == ShaderRenderCaseInstance::IMAGE_BACKING_MODE_SPARSE)
	{
		// Texel declaration
		frag << "\t" << outType << " texel;\n";
		frag << "\tint success = " << funcCall << ";\n";

		// Check sparse validity, and handle each case
		frag << "\tif (sparseTexelsResidentARB(success))\n"
			 << "\t\to_color = texel;\n"
			 <<	"\telse\n"
			 << "\t\to_color = " << outType << "(0.0, 0.0, 0.0, 1.0);\n";
	}
	else
	{
		frag << "\t\to_color = " << funcCall << ";\n";
	}

	frag << "}\n";

	return glu::FragmentSource(frag.str());
}